

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsLotkaVolterra_ASA.c
# Opt level: O3

int lotka_volterra(sunrealtype t,N_Vector uvec,N_Vector udotvec,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  
  pdVar1 = (double *)N_VGetArrayPointer();
  pdVar2 = (double *)N_VGetArrayPointer(udotvec);
  *pdVar2 = *pdVar1 * *user_data - *(double *)((long)user_data + 8) * *pdVar1 * pdVar1[1];
  pdVar2[1] = *(double *)((long)user_data + 0x18) * *pdVar1 * pdVar1[1] -
              pdVar1[1] * *(double *)((long)user_data + 0x10);
  return 0;
}

Assistant:

int lotka_volterra(sunrealtype t, N_Vector uvec, N_Vector udotvec, void* user_data)
{
  sunrealtype* p    = (sunrealtype*)user_data;
  sunrealtype* u    = N_VGetArrayPointer(uvec);
  sunrealtype* udot = N_VGetArrayPointer(udotvec);

  udot[0] = p[0] * u[0] - p[1] * u[0] * u[1];
  udot[1] = -p[2] * u[1] + p[3] * u[0] * u[1];

  return 0;
}